

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

void __thiscall
Refal2::CProgramPrintHelper::Label(CProgramPrintHelper *this,ostream *outputStream,TLabel label)

{
  ostream *poVar1;
  CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  if ((this->super_CPrintHelper).printLabelWithModule == true) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)outputStream,label / 0x10000);
    std::operator<<(poVar1,":");
  }
  this_00 = &CProgram::Module((this->program).
                              super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,label / 0x10000)->Functions;
  pbVar2 = CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetKey(this_00,label % 0x10000);
  std::operator<<(outputStream,(string *)pbVar2);
  return;
}

Assistant:

void CProgramPrintHelper::Label( std::ostream& outputStream,
	const TLabel label ) const
{
	const int labelModuleId = label / LabelMask;
	if( PrintLabelWithModule() ) {
		outputStream << labelModuleId << ":";
	}
	outputStream << program->Module( labelModuleId ).Functions.
		GetKey(	label % LabelMask );
}